

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

bool __thiscall BaseIndex::Commit(BaseIndex *this)

{
  uint256 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long in_FS_OFFSET;
  char cVar3;
  string_view logging_function;
  string_view source_file;
  CBlockLocator local_b8;
  CDBBatch batch;
  uint256 local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = (this->m_best_block_index)._M_b._M_p != (__pointer_type)0x0;
  if ((bool)cVar3) {
    iVar2 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
    CDBBatch::CDBBatch(&batch,(CDBWrapper *)CONCAT44(extraout_var,iVar2));
    iVar2 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xd])(this,&batch);
    cVar3 = (char)iVar2;
    if (cVar3 != '\0') {
      (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
      puVar1 = ((this->m_best_block_index)._M_b._M_p)->phashBlock;
      if (puVar1 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_48.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      local_48.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      local_48.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_48.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      GetLocator(&local_b8,
                 (this->m_chain)._M_t.
                 super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                 .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl,&local_48);
      CDBBatch::Write<unsigned_char,CBlockLocator>(&batch,"B9BaseIndex",&local_b8);
      if (local_b8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_b8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      iVar2 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
      cVar3 = CDBWrapper::WriteBatch((CDBWrapper *)CONCAT44(extraout_var_00,iVar2),&batch,false);
    }
    CDBBatch::~CDBBatch(&batch);
  }
  if (cVar3 == '\0') {
    logging_function._M_str = "Commit";
    logging_function._M_len = 6;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintFormatInternal<char[7],std::__cxx11::string>
              (logging_function,source_file,0xf1,ALL,Error,(ConstevalFormatString<2U>)0x82c606,
               (char (*) [7])0x8817ac,&this->m_name);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)cVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::Commit()
{
    // Don't commit anything if we haven't indexed any block yet
    // (this could happen if init is interrupted).
    bool ok = m_best_block_index != nullptr;
    if (ok) {
        CDBBatch batch(GetDB());
        ok = CustomCommit(batch);
        if (ok) {
            GetDB().WriteBestBlock(batch, GetLocator(*m_chain, m_best_block_index.load()->GetBlockHash()));
            ok = GetDB().WriteBatch(batch);
        }
    }
    if (!ok) {
        LogError("%s: Failed to commit latest %s state\n", __func__, GetName());
        return false;
    }
    return true;
}